

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4SweepVars2Q(Aig_Man_t *pAig,Vec_Int_t *vOrder,int fAddLis)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  undefined1 auVar4 [16];
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  pVVar5 = (Vec_Int_t *)calloc(1,0x10);
  iVar1 = pAig->vObjs->nSize;
  lVar9 = (long)iVar1;
  if (lVar9 < 1) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar9 * 4);
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar1;
    auVar4 = _DAT_0094e250;
    lVar9 = lVar9 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar10 = auVar10 ^ _DAT_0094e250;
    auVar12 = _DAT_0094f530;
    auVar14 = _DAT_0094e240;
    do {
      auVar15 = auVar14 ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)piVar6 + lVar9) = 1;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)piVar6 + lVar9 + 4) = 1;
      }
      auVar15 = auVar12 ^ auVar4;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)piVar6 + lVar9 + 8) = 1;
        *(undefined4 *)((long)piVar6 + lVar9 + 0xc) = 1;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(iVar1 + 3U >> 2) << 4 != lVar9);
  }
  pVVar5->nSize = iVar1;
  iVar11 = pAig->nRegs;
  if (0 < iVar11) {
    pVVar3 = pAig->vCis;
    iVar16 = pAig->nTruePis;
    iVar7 = 0;
    do {
      uVar8 = iVar16 + iVar7;
      if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) goto LAB_00849893;
      iVar2 = *(int *)((long)pVVar3->pArray[uVar8] + 0x24);
      if (((long)iVar2 < 0) || (vOrder->nSize <= iVar2)) goto LAB_00849874;
      iVar2 = vOrder->pArray[iVar2];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_008498b2;
      piVar6[iVar2] = 0;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar11);
    if (fAddLis != 0 && 0 < iVar11) {
      pVVar3 = pAig->vCos;
      iVar16 = pAig->nTruePos;
      iVar7 = 0;
      do {
        uVar8 = iVar16 + iVar7;
        if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) {
LAB_00849893:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar2 = *(int *)((long)pVVar3->pArray[uVar8] + 0x24);
        if (((long)iVar2 < 0) || (vOrder->nSize <= iVar2)) {
LAB_00849874:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = vOrder->pArray[iVar2];
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_008498b2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar6[iVar2] = 0;
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar11);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepVars2Q( Aig_Man_t * pAig, Vec_Int_t * vOrder, int fAddLis )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObj;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Aig_ManObjNumMax(pAig), 1 );
    // add flop outputs
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    // add flop inputs
    if ( fAddLis )
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    return vVars2Q;
}